

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  pointer ppIVar2;
  IReporter *pIVar3;
  ContextState *pCVar4;
  pointer pSVar5;
  long lVar6;
  pointer ppIVar7;
  IReporter **curr_rep;
  char *__s;
  bool bVar8;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  String local_50;
  undefined1 local_38;
  
  __s = "<unknown signal>";
  lVar6 = 8;
  do {
    if (*(int *)((long)&PTR_typeinfo_name_00164058 + lVar6) == sig) {
      __s = *(char **)((long)&(anonymous_namespace)::signalDefs + lVar6);
      break;
    }
    bVar8 = lVar6 != 0x58;
    lVar6 = lVar6 + 0x10;
  } while (bVar8);
  reset();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_71);
  pCVar4 = detail::g_cs;
  piVar1 = &(detail::g_cs->super_CurrentTestCaseStats).failure_flags;
  *piVar1 = *piVar1 | 4;
  ppIVar7 = (pCVar4->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (pCVar4->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar7 != ppIVar2) {
    do {
      pIVar3 = *ppIVar7;
      String::String(&local_50,(char *)local_70[0]);
      local_38 = 1;
      (*pIVar3->_vptr_IReporter[6])(pIVar3,&local_50);
      String::~String(&local_50);
      ppIVar7 = ppIVar7 + 1;
    } while (ppIVar7 != ppIVar2);
  }
  pSVar5 = (detail::g_cs->subcasesStack).
           super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != (detail::g_cs->subcasesStack).
                super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      (detail::g_cs->subcasesStack).
      super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar5 + -1;
      String::~String(&pSVar5[-1].m_name);
      ppIVar2 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                     super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2;
          ppIVar7 = ppIVar7 + 1) {
        (*(*ppIVar7)->_vptr_IReporter[8])();
      }
      pSVar5 = (detail::g_cs->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (pSVar5 != (detail::g_cs->subcasesStack).
                       super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  detail::ContextState::finalizeTestCaseData(detail::g_cs);
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1
      ) {
    (*(*ppIVar7)->_vptr_IReporter[5])(*ppIVar7,&detail::g_cs->super_CurrentTestCaseStats);
  }
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1
      ) {
    (*(*ppIVar7)->_vptr_IReporter[2])(*ppIVar7,&detail::g_cs->super_TestRunStats);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  raise(sig);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }